

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O2

void stealamulet(monst *mtmp)

{
  boolean bVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  char *pcVar5;
  obj **otmp;
  
  if ((u.uhave._0_1_ & 1) == 0) {
    if (((u.uhave._0_1_ & 0x10) != 0) &&
       (sVar3 = mtmp->mnum, sVar2 = quest_info(0x20), sVar3 == sVar2)) {
      otmp = &invent;
      do {
        otmp = &((obj *)otmp)->nobj->nobj;
        if ((obj *)otmp == (obj *)0x0) {
          return;
        }
        bVar1 = is_quest_artifact((obj *)otmp);
      } while (bVar1 == '\0');
      goto LAB_0024510c;
    }
    if ((u.uhave._0_1_ & 2) == 0) {
      sVar2 = 0x1bd;
      sVar3 = 0;
      if (((u.uhave._0_1_ & 4) == 0) && (sVar2 = 0x10b, sVar3 = 0, (u.uhave._0_1_ & 8) == 0)) {
        return;
      }
    }
    else {
      sVar3 = 0x104;
      sVar2 = 0x10c;
    }
  }
  else {
    sVar3 = 0xd8;
    sVar2 = 0xd9;
  }
  otmp = &invent;
  do {
    otmp = &((obj *)otmp)->nobj->nobj;
    if ((obj *)otmp == (obj *)0x0) {
      return;
    }
  } while ((sVar2 != ((obj *)otmp)->otyp) &&
          ((sVar3 != ((obj *)otmp)->otyp || ((mtmp->field_0x63 & 0x20) != 0))));
LAB_0024510c:
  if (((obj *)otmp)->owornmask != 0) {
    remove_worn_item((obj *)otmp,'\x01');
  }
  freeinv((obj *)otmp);
  mpickobj(mtmp,(obj *)otmp);
  pcVar4 = Monnam(mtmp);
  pcVar5 = doname((obj *)otmp);
  pline("%s stole %s!",pcVar4,pcVar5);
  if (((mtmp->data->mflags1 & 0x2000000) != 0) && (bVar1 = tele_restrict(mtmp), bVar1 == '\0')) {
    rloc(level,mtmp,'\0');
    return;
  }
  return;
}

Assistant:

void stealamulet(struct monst *mtmp)
{
    struct obj *otmp = NULL;
    int real=0, fake=0;

    /* select the artifact to steal */
    if (u.uhave.amulet) {
	real = AMULET_OF_YENDOR;
	fake = FAKE_AMULET_OF_YENDOR;
    } else if (u.uhave.questart && mtmp->mnum == quest_info(MS_NEMESIS)) {
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (is_quest_artifact(otmp)) break;
	if (!otmp) return;	/* should we panic instead? */
    } else if (u.uhave.bell) {
	real = BELL_OF_OPENING;
	fake = BELL;
    } else if (u.uhave.book) {
	real = SPE_BOOK_OF_THE_DEAD;
    } else if (u.uhave.menorah) {
	real = CANDELABRUM_OF_INVOCATION;
    } else return;	/* you have nothing of special interest */

    if (!otmp) {
	/* If we get here, real and fake have been set up. */
	for (otmp = invent; otmp; otmp = otmp->nobj)
	    if (otmp->otyp == real || (otmp->otyp == fake && !mtmp->iswiz))
		break;
    }

    if (otmp) { /* we have something to snatch */
	if (otmp->owornmask)
	    remove_worn_item(otmp, TRUE);
	freeinv(otmp);
	/* mpickobj wont merge otmp because none of the above things
	   to steal are mergable */
	mpickobj(mtmp,otmp);	/* may merge and free otmp */
	pline("%s stole %s!", Monnam(mtmp), doname(otmp));
	if (can_teleport(mtmp->data) && !tele_restrict(mtmp))
	    rloc(level, mtmp, FALSE);
    }
}